

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O2

void __thiscall
http_request_method_parsing_simple02_Test::TestBody(http_request_method_parsing_simple02_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  AssertHelper AStack_68;
  AssertHelper local_60;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  http_request_method method;
  sub_string str;
  
  str = sub_string::literal<5ul>((char (*) [5])"GET ");
  method = parse_request_method(&str);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<http_request_method,http_request_method>
            ((internal *)&gtest_ar,"method","http_request_method::GET",&method,
             (http_request_method *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x10,message);
    testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&AStack_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = sub_string::empty(&str);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&AStack_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"!str.empty()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x11,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&AStack_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(http_request_method_parsing, simple02)
{
    sub_string str = sub_string::literal("GET ");
    http_request_method method = parse_request_method(str);
    EXPECT_EQ(method, http_request_method::GET);
    EXPECT_TRUE(!str.empty());
}